

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O1

DdGen * Cudd_FirstCube(DdManager *dd,DdNode *f,int **cube,double *value)

{
  uint uVar1;
  DdNode *pDVar2;
  int iVar3;
  DdGen *__ptr;
  int *__ptr_00;
  ulong uVar4;
  DdNode **__s;
  long lVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  
  if (f != (DdNode *)0x0 && dd != (DdManager *)0x0) {
    __ptr = (DdGen *)malloc(0x38);
    if (__ptr == (DdGen *)0x0) {
      dd->errorCode = CUDD_MEMORY_OUT;
    }
    else {
      __ptr->manager = dd;
      __ptr->type = 0;
      __ptr->status = 0;
      (__ptr->gen).cubes.cube = (int *)0x0;
      *(undefined8 *)((long)&(__ptr->gen).cubes.cube + 4) = 0;
      *(undefined8 *)((long)&(__ptr->gen).cubes.value + 4) = 0;
      (__ptr->stack).stack = (DdNode **)0x0;
      __ptr->node = (DdNode *)0x0;
      uVar1 = dd->size;
      __ptr_00 = (int *)malloc((long)(int)uVar1 * 4);
      (__ptr->gen).cubes.cube = __ptr_00;
      if (__ptr_00 == (int *)0x0) {
        dd->errorCode = CUDD_MEMORY_OUT;
      }
      else {
        if (0 < (int)uVar1) {
          uVar4 = 0;
          do {
            __ptr_00[uVar4] = 2;
            uVar4 = uVar4 + 1;
          } while (uVar1 != uVar4);
        }
        __s = (DdNode **)malloc((long)(int)uVar1 * 8 + 8);
        (__ptr->stack).stack = __s;
        if (__s != (DdNode **)0x0) {
          if (-1 < (int)uVar1) {
            memset(__s,0,(ulong)uVar1 * 8 + 8);
          }
          iVar3 = (__ptr->stack).sp;
          __s[iVar3] = f;
          iVar3 = iVar3 + 1;
          (__ptr->stack).sp = iVar3;
          while( true ) {
            while( true ) {
              lVar5 = (long)iVar3;
              pDVar6 = __s[lVar5 + -1];
              pDVar7 = (DdNode *)((ulong)pDVar6 & 0xfffffffffffffffe);
              if ((ulong)pDVar7->index == 0x7fffffff) break;
              (__ptr->gen).cubes.cube[pDVar7->index] = 0;
              pDVar2 = (pDVar7->type).kids.E;
              pDVar9 = (DdNode *)((ulong)pDVar2 ^ 1);
              if (pDVar6 == pDVar7) {
                pDVar9 = pDVar2;
              }
              __s[lVar5] = pDVar9;
              iVar3 = iVar3 + 1;
            }
            if ((pDVar6 != (DdNode *)((ulong)dd->one ^ 1)) && (pDVar6 != dd->background)) break;
            if (iVar3 == 1) goto LAB_0079c840;
            lVar5 = lVar5 + -1;
            while( true ) {
              pDVar7 = __s[lVar5 + -1];
              pDVar8 = (DdNode *)((ulong)pDVar7 & 0xfffffffffffffffe);
              pDVar2 = (pDVar8->type).kids.T;
              pDVar9 = (DdNode *)((ulong)pDVar2 ^ 1);
              if (pDVar7 == pDVar8) {
                pDVar9 = pDVar2;
              }
              if (pDVar9 != pDVar6) break;
              (__ptr->gen).cubes.cube[pDVar8->index] = 2;
              iVar3 = iVar3 + -1;
              lVar5 = lVar5 + -1;
              pDVar6 = pDVar7;
              if (lVar5 == 0) {
                iVar3 = 1;
                goto LAB_0079c840;
              }
            }
            (__ptr->gen).cubes.cube[pDVar8->index] = 1;
            __s[lVar5] = pDVar9;
          }
          (__ptr->stack).sp = iVar3;
          __ptr->status = 1;
          (__ptr->gen).cubes.value = (pDVar6->type).value;
          goto LAB_0079c84c;
        }
        dd->errorCode = CUDD_MEMORY_OUT;
        free(__ptr_00);
        (__ptr->gen).cubes.cube = (int *)0x0;
      }
      free(__ptr);
    }
  }
  return (DdGen *)0x0;
LAB_0079c840:
  __ptr->status = 0;
  (__ptr->stack).sp = iVar3 + -1;
LAB_0079c84c:
  *cube = (__ptr->gen).cubes.cube;
  *value = (__ptr->gen).cubes.value;
  return __ptr;
}

Assistant:

DdGen *
Cudd_FirstCube(
  DdManager * dd,
  DdNode * f,
  int ** cube,
  CUDD_VALUE_TYPE * value)
{
    DdGen *gen;
    DdNode *top, *treg, *next, *nreg, *prev, *preg;
    int i;
    int nvars;

    /* Sanity Check. */
    if (dd == NULL || f == NULL) return(NULL);

    /* Allocate generator an initialize it. */
    gen = ABC_ALLOC(DdGen,1);
    if (gen == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }

    gen->manager = dd;
    gen->type = CUDD_GEN_CUBES;
    gen->status = CUDD_GEN_EMPTY;
    gen->gen.cubes.cube = NULL;
    gen->gen.cubes.value = DD_ZERO_VAL;
    gen->stack.sp = 0;
    gen->stack.stack = NULL;
    gen->node = NULL;

    nvars = dd->size;
    gen->gen.cubes.cube = ABC_ALLOC(int,nvars);
    if (gen->gen.cubes.cube == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(gen);
        return(NULL);
    }
    for (i = 0; i < nvars; i++) gen->gen.cubes.cube[i] = 2;

    /* The maximum stack depth is one plus the number of variables.
    ** because a path may have nodes at all levels, including the
    ** constant level.
    */
    gen->stack.stack = ABC_ALLOC(DdNodePtr, nvars+1);
    if (gen->stack.stack == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(gen->gen.cubes.cube);
        ABC_FREE(gen);
        return(NULL);
    }
    for (i = 0; i <= nvars; i++) gen->stack.stack[i] = NULL;

    /* Find the first cube of the onset. */
    gen->stack.stack[gen->stack.sp] = f; gen->stack.sp++;

    while (1) {
        top = gen->stack.stack[gen->stack.sp-1];
        treg = Cudd_Regular(top);
        if (!cuddIsConstant(treg)) {
            /* Take the else branch first. */
            gen->gen.cubes.cube[treg->index] = 0;
            next = cuddE(treg);
            if (top != treg) next = Cudd_Not(next);
            gen->stack.stack[gen->stack.sp] = next; gen->stack.sp++;
        } else if (top == Cudd_Not(DD_ONE(dd)) || top == dd->background) {
            /* Backtrack */
            while (1) {
                if (gen->stack.sp == 1) {
                    /* The current node has no predecessor. */
                    gen->status = CUDD_GEN_EMPTY;
                    gen->stack.sp--;
                    goto done;
                }
                prev = gen->stack.stack[gen->stack.sp-2];
                preg = Cudd_Regular(prev);
                nreg = cuddT(preg);
                if (prev != preg) {next = Cudd_Not(nreg);} else {next = nreg;}
                if (next != top) { /* follow the then branch next */
                    gen->gen.cubes.cube[preg->index] = 1;
                    gen->stack.stack[gen->stack.sp-1] = next;
                    break;
                }
                /* Pop the stack and try again. */
                gen->gen.cubes.cube[preg->index] = 2;
                gen->stack.sp--;
                top = gen->stack.stack[gen->stack.sp-1];
                treg = Cudd_Regular(top);
            }
        } else {
            gen->status = CUDD_GEN_NONEMPTY;
            gen->gen.cubes.value = cuddV(top);
            goto done;
        }
    }

done:
    *cube = gen->gen.cubes.cube;
    *value = gen->gen.cubes.value;
    return(gen);

}